

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Message *message;
  AssertHelper *this_00;
  hasher hVar2;
  key_equal kVar3;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  AssertionResult gtest_ar_1;
  TypeParam ht_iter_fourarg;
  TypeParam ht_iter_threearg;
  TypeParam ht_iter_twoarg;
  TypeParam ht_iter_onearg;
  TypeParam ht_iter_noarg;
  value_type *end;
  value_type *begin;
  int num_inputs;
  value_type input [4];
  int old_alloc_count;
  AssertionResult gtest_ar;
  TypeParam ht_fourarg;
  TypeParam ht_threearg;
  TypeParam ht_twoarg;
  TypeParam ht_onearg;
  TypeParam ht_noarg;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  int alloc_count;
  hasher hasher;
  undefined8 in_stack_ffffffffffffeeb8;
  int iVar4;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeec0;
  key_equal *in_stack_ffffffffffffeec8;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffeed8;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffeee0;
  undefined4 in_stack_ffffffffffffeee8;
  Type in_stack_ffffffffffffeeec;
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffeef0;
  undefined4 in_stack_ffffffffffffef00;
  undefined4 in_stack_ffffffffffffef04;
  Message *in_stack_ffffffffffffef38;
  AssertHelper *in_stack_ffffffffffffef40;
  value_type *in_stack_ffffffffffffeff8;
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff000;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e98;
  int local_e88;
  undefined4 local_e84;
  AssertionResult local_e80 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e60;
  int local_e50;
  undefined4 local_e4c;
  AssertionResult local_e48 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e28;
  int local_e18;
  undefined4 local_e14;
  AssertionResult local_e10 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_df0;
  int local_de0;
  undefined4 local_ddc;
  AssertionResult local_dd8 [2];
  key_equal local_db8;
  key_equal local_da8;
  int local_d98;
  undefined4 local_d94;
  AssertionResult local_d90 [2];
  hasher local_d70;
  hasher local_d60;
  int local_d50;
  undefined4 local_d4c;
  AssertionResult local_d48 [2];
  key_equal local_d28;
  key_equal local_d18;
  int local_d08;
  undefined4 local_d04;
  AssertionResult local_d00 [2];
  Message *local_ce0;
  int local_cd8;
  Message *local_cd0;
  int local_cc8;
  int local_cc0;
  undefined4 local_cbc;
  AssertionResult local_cb8 [2];
  key_equal local_c98;
  key_equal local_c88;
  int local_c78;
  undefined4 local_c74;
  AssertionResult local_c70 [2];
  hasher local_c50;
  hasher local_c40;
  int local_c30;
  undefined4 local_c2c;
  AssertionResult local_c28 [2];
  key_equal local_c08;
  key_equal local_bf8;
  int local_be8;
  undefined4 local_be4;
  AssertionResult local_be0 [2];
  hasher local_bc0;
  hasher local_bb0;
  int local_ba0;
  undefined4 local_b9c;
  AssertionResult local_b98 [2];
  key_equal local_b78;
  key_equal local_b68;
  int local_b58;
  undefined4 local_b54;
  AssertionResult local_b50 [2];
  hasher local_b30;
  hasher local_b20;
  int local_b10;
  undefined4 local_b0c;
  AssertionResult local_b08 [2];
  key_equal local_ae8;
  key_equal local_ad8;
  int local_ac8;
  undefined4 local_ac4;
  AssertionResult local_ac0 [2];
  hasher local_aa0;
  hasher local_a90;
  int local_a80;
  undefined4 local_a7c;
  AssertionResult local_a78 [2];
  key_equal local_a58;
  key_equal local_a48;
  int local_a38;
  undefined4 local_a34;
  AssertionResult local_a30 [2];
  hasher local_a10;
  hasher local_a00;
  int local_9f0;
  undefined4 local_9ec;
  AssertionResult local_9e8 [2];
  key_equal local_9c8;
  key_equal local_9b8;
  int local_9a8;
  undefined4 local_9a4;
  AssertionResult local_9a0 [2];
  hasher local_980;
  hasher local_970;
  int local_960;
  undefined4 local_95c;
  AssertionResult local_958 [2];
  undefined4 local_934;
  size_type local_930;
  AssertionResult local_928 [2];
  undefined4 local_904;
  size_type local_900;
  AssertionResult local_8f8 [2];
  undefined4 local_8d4;
  size_type local_8d0;
  AssertionResult local_8c8 [2];
  undefined4 local_8a4;
  size_type local_8a0;
  AssertionResult local_898 [2];
  undefined4 local_874;
  size_type local_870;
  AssertionResult local_868 [2];
  undefined4 local_844;
  size_type local_840;
  AssertionResult local_838 [2];
  AssertionResult local_818 [6];
  value_type local_7b0;
  int local_7ac;
  AssertionResult local_798 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_6f0 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_648;
  Hasher local_634 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_590;
  Hasher local_580;
  Hasher local_574 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_4d0;
  Hasher local_4c0;
  Hasher local_4b4 [13];
  undefined1 *local_410;
  value_type *local_408;
  undefined4 local_3fc;
  value_type local_3f8;
  value_type local_3f4;
  value_type local_3f0;
  value_type local_3ec;
  undefined1 auStack_3e8 [12];
  int local_3dc;
  undefined4 local_3c4;
  AssertionResult local_3c0 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_318 [10];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_270;
  Hasher local_25c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1b8;
  Hasher local_1a8;
  Hasher local_19c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_f8;
  Hasher local_e8 [2];
  Hasher local_cc [13];
  undefined1 local_28 [40];
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20);
  Hasher::Hasher((Hasher *)(local_28 + 0x14),1);
  local_28._16_4_ = 0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28,2,
             (int *)(local_28 + 0x10));
  Hasher::Hasher(local_cc,0);
  Hasher::Hasher(local_e8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_f8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_f8);
  Hasher::Hasher(local_19c,0);
  Hasher::Hasher(&local_1a8,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1b8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1b8);
  Hasher::Hasher(local_25c,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_270,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_270);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_318,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_318);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)in_stack_ffffffffffffeec0);
  local_3c4 = 1;
  testing::internal::CmpHelperLE<int,int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18039);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1809c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1810d);
  local_3dc = local_28._16_4_;
  local_3f8 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeec0,iVar4);
  local_3f4 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeec0,iVar4);
  local_3f0 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeec0,iVar4);
  local_3ec = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeec0,iVar4);
  local_3fc = 4;
  local_408 = &local_3f8;
  local_410 = auStack_3e8;
  Hasher::Hasher(local_4b4,0);
  Hasher::Hasher(&local_4c0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_4d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashSet<int_const*>
            (in_stack_ffffffffffffeef0,
             (int *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
             (int *)in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_4d0);
  Hasher::Hasher(local_574,0);
  Hasher::Hasher(&local_580,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_590,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashSet<int_const*>
            (in_stack_ffffffffffffeef0,
             (int *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
             (int *)in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_590);
  Hasher::Hasher(local_634,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_648,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashSet<int_const*>
            (in_stack_ffffffffffffeef0,
             (int *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
             (int *)in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_648);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_6f0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashSet<int_const*>
            (in_stack_ffffffffffffeef0,
             (int *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
             (int *)in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_6f0);
  this_01 = (BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_28;
  google::
  HashtableInterface_SparseHashSet<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashSet<int_const*>
            (in_stack_ffffffffffffeef0,
             (int *)CONCAT44(in_stack_ffffffffffffeeec,in_stack_ffffffffffffeee8),
             (int *)in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8,
             (hasher *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  testing::internal::CmpHelperGT<int,int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_798);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18646);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb186a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1871a);
  local_3dc = local_28._16_4_;
  for (local_7ac = 2; local_7ac < 2000; local_7ac = local_7ac + 1) {
    local_7b0 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_ffffffffffffeec0,(int)((ulong)this_01 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  }
  testing::internal::CmpHelperGT<int,int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_818);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18812);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb18875);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb188e6);
  local_840 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb188f3);
  local_844 = 100;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             (unsigned_long *)in_stack_ffffffffffffeec8,(uint *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_838);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1898b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb189ee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb18a5f);
  local_870 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb18a6c);
  local_874 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             (unsigned_long *)in_stack_ffffffffffffeec8,(uint *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_868);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18b04);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb18b67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb18bd8);
  local_8a0 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb18be5);
  local_8a4 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             (unsigned_long *)in_stack_ffffffffffffeec8,(uint *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_898);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18c7d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb18ce0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb18d51);
  local_8d0 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb18d5e);
  local_8d4 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             (unsigned_long *)in_stack_ffffffffffffeec8,(uint *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18df6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb18e59);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb18eca);
  local_900 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb18ed7);
  local_904 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             (unsigned_long *)in_stack_ffffffffffffeec8,(uint *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb18f6f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb18fd2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb19043);
  local_930 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb19050);
  local_934 = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             (unsigned_long *)in_stack_ffffffffffffeec8,(uint *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_928);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb190e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1914b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb191bc);
  local_95c = 0;
  local_980 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_970 = local_980;
  local_960 = Hasher::id(&local_970);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_958);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb192a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1930b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1937c);
  local_9a4 = 0;
  local_9c8 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_9b8 = local_9c8;
  local_9a8 = Hasher::id(&local_9b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb19468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb194cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1953c);
  local_9ec = 0;
  local_a10 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_a00 = local_a10;
  local_9f0 = Hasher::id(&local_a00);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb19628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1968b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb196fc);
  local_a34 = 0;
  local_a58 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_a48 = local_a58;
  local_a38 = Hasher::id(&local_a48);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb197e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1984b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb198bc);
  local_a7c = 1;
  local_aa0 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_a90 = local_aa0;
  local_a80 = Hasher::id(&local_a90);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb199a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb19a0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb19a7c);
  local_ac4 = 0;
  local_ae8 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_ad8 = local_ae8;
  local_ac8 = Hasher::id(&local_ad8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ac0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb19b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb19bcb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb19c3c);
  local_b0c = 1;
  local_b30 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_b20 = local_b30;
  local_b10 = Hasher::id(&local_b20);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b08);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb19d28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb19d8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb19dfc);
  local_b54 = 1;
  local_b78 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_b68 = local_b78;
  local_b58 = Hasher::id(&local_b68);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb19ee8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb19f4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb19fbc);
  local_b9c = 0;
  local_bc0 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_bb0 = local_bc0;
  local_ba0 = Hasher::id(&local_bb0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1a0a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1a10b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1a17c);
  local_be4 = 0;
  local_c08 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_bf8 = local_c08;
  local_be8 = Hasher::id(&local_bf8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_be0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1a268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1a2cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1a33c);
  local_c2c = 0;
  local_c50 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_c40 = local_c50;
  local_c30 = Hasher::id(&local_c40);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1a428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1a48b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1a4fc);
  local_c74 = 0;
  local_c98 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_c88 = local_c98;
  local_c78 = Hasher::id(&local_c88);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    in_stack_ffffffffffffef40 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb1a5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1a64b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1a6bc);
  local_cbc = 1;
  hVar2 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct(in_stack_ffffffffffffeed0);
  local_cd8 = hVar2.num_compares_;
  message = hVar2._0_8_;
  local_ce0 = message;
  local_cd0 = message;
  local_cc8 = local_cd8;
  local_cc0 = Hasher::id((Hasher *)&local_cd0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cb8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1a7a2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1a7ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1a870);
  local_d04 = 0;
  local_d28 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq(in_stack_ffffffffffffeed0);
  local_d18 = local_d28;
  local_d08 = Hasher::id(&local_d18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1a950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1a9ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1aa1e);
  local_d4c = 1;
  local_d70 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct(in_stack_ffffffffffffeed0);
  local_d60 = local_d70;
  local_d50 = Hasher::id(&local_d60);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeef0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1aafe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeeec,
               (char *)in_stack_ffffffffffffeee0,(int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1ab5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1abcc);
  local_d94 = 1;
  kVar3 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::key_eq(in_stack_ffffffffffffeed0);
  local_db8 = kVar3;
  local_da8 = kVar3;
  local_d98 = Hasher::id(&local_da8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d90);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffeee0 =
         (HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb1acac);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffeee0,
               (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),(char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1ad09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1ad7a);
  local_ddc = 0;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_de0 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_df0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_df0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_dd8);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffeed8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xb1ae56);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffeee0,
               (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),(char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1aeb3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1af24);
  local_e14 = 0;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_e18 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_e28);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e10);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffeed0 =
         (BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xb1b000);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffeee0,
               (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),(char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1b05d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1b0ce);
  local_e4c = 2;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_e50 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_e60);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e48);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    in_stack_ffffffffffffeec8 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb1b1aa);
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffeee0,
               (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20),(char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeec0);
    testing::Message::~Message((Message *)0xb1b207);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1b278);
  local_e84 = 2;
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_01);
  local_e88 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(&local_e98);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffeed8,(char *)in_stack_ffffffffffffeed0,
             &in_stack_ffffffffffffeec8->id_,(int *)in_stack_ffffffffffffeec0);
  iVar4 = (int)((ulong)in_stack_ffffffffffffeed8 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e80);
  if (!bVar1) {
    testing::Message::Message(kVar3._0_8_);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb1b354)
    ;
    testing::internal::AssertHelper::AssertHelper
              (kVar3._0_8_,kVar3.num_compares_,(char *)in_stack_ffffffffffffeee0,iVar4,
               (char *)in_stack_ffffffffffffeed0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffef40,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb1b3b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1b422);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b42f);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b43c);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b449);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b456);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b463);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b470);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b47d);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b48a);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b497);
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb1b4a4);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_28);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Constructors) {
  // The key/value types don't matter here, so I just test on one set
  // of tables, the ones with int keys, which can easily handle the
  // placement-news we have to do below.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  int alloc_count = 0;
  Alloc<typename TypeParam::key_type> alloc(2, &alloc_count);

  TypeParam ht_noarg;
  TypeParam ht_onearg(100);
  TypeParam ht_twoarg(100, hasher);
  TypeParam ht_threearg(100, hasher, hasher);  // hasher serves as key_equal too
  TypeParam ht_fourarg(100, hasher, hasher, alloc);

  // The allocator should have been called at most once, for the last ht.
  EXPECT_LE(1, alloc_count);
  int old_alloc_count = alloc_count;

  const typename TypeParam::value_type input[] = {
      this->UniqueObject(1), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};
  const int num_inputs = sizeof(input) / sizeof(input[0]);
  const typename TypeParam::value_type* begin = &input[0];
  const typename TypeParam::value_type* end = begin + num_inputs;
  TypeParam ht_iter_noarg(begin, end);
  TypeParam ht_iter_onearg(begin, end, 100);
  TypeParam ht_iter_twoarg(begin, end, 100, hasher);
  TypeParam ht_iter_threearg(begin, end, 100, hasher, hasher);
  TypeParam ht_iter_fourarg(begin, end, 100, hasher, hasher, alloc);
  // Now the allocator should have been called more.
  EXPECT_GT(alloc_count, old_alloc_count);
  old_alloc_count = alloc_count;

  // Let's do a lot more inserting and make sure the alloc-count goes up
  for (int i = 2; i < 2000; i++) ht_fourarg.insert(this->UniqueObject(i));
  EXPECT_GT(alloc_count, old_alloc_count);

  EXPECT_LT(ht_noarg.bucket_count(), 100u);
  EXPECT_GE(ht_onearg.bucket_count(), 100u);
  EXPECT_GE(ht_twoarg.bucket_count(), 100u);
  EXPECT_GE(ht_threearg.bucket_count(), 100u);
  EXPECT_GE(ht_fourarg.bucket_count(), 100u);
  EXPECT_GE(ht_iter_onearg.bucket_count(), 100u);

  // When we pass in a hasher -- it can serve both as the hash-function
  // and the key-equal function -- its id should be 1.  Where we don't
  // pass it in and use the default Hasher object, the id should be 0.
  EXPECT_EQ(0, ht_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_noarg.key_eq().id());
  EXPECT_EQ(0, ht_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_onearg.key_eq().id());
  EXPECT_EQ(1, ht_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_threearg.key_eq().id());

  EXPECT_EQ(0, ht_iter_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_noarg.key_eq().id());
  EXPECT_EQ(0, ht_iter_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_onearg.key_eq().id());
  EXPECT_EQ(1, ht_iter_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_iter_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_iter_threearg.key_eq().id());

  // Likewise for the allocator
  EXPECT_EQ(0, ht_threearg.get_allocator().id());
  EXPECT_EQ(0, ht_iter_threearg.get_allocator().id());
  EXPECT_EQ(2, ht_fourarg.get_allocator().id());
  EXPECT_EQ(2, ht_iter_fourarg.get_allocator().id());
}